

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cpp
# Opt level: O1

void FlatStream_Close(TBlockStream *pStream)

{
  FILE_BITMAP_FOOTER Footer;
  undefined8 local_20;
  DWORD local_18;
  ULONGLONG local_14;
  DWORD local_c;
  
  if ((pStream->FileBitmap != (void *)0x0) && (pStream->IsModified != 0)) {
    (*(pStream->super_TFileStream).BaseWrite)
              (&pStream->super_TFileStream,&(pStream->super_TFileStream).StreamSize,
               pStream->FileBitmap,pStream->BitmapSize);
    local_20 = 0x333767470;
    local_18 = (pStream->super_TFileStream).BuildNumber;
    local_14 = (pStream->super_TFileStream).StreamSize;
    local_c = pStream->BlockSize;
    (*(pStream->super_TFileStream).BaseWrite)
              (&pStream->super_TFileStream,(ULONGLONG *)0x0,&local_20,0x18);
  }
  if (pStream->FileBitmap != (void *)0x0) {
    free(pStream->FileBitmap);
  }
  pStream->FileBitmap = (void *)0x0;
  (*(pStream->super_TFileStream).BaseClose)(&pStream->super_TFileStream);
  return;
}

Assistant:

static void FlatStream_Close(TBlockStream * pStream)
{
    FILE_BITMAP_FOOTER Footer;

    if(pStream->FileBitmap && pStream->IsModified)
    {
        // Write the file bitmap
        pStream->BaseWrite(pStream, &pStream->StreamSize, pStream->FileBitmap, pStream->BitmapSize);

        // Prepare and write the file footer
        Footer.Signature   = ID_FILE_BITMAP_FOOTER;
        Footer.Version     = 3;
        Footer.BuildNumber = pStream->BuildNumber;
        Footer.MapOffsetLo = (DWORD)(pStream->StreamSize & 0xFFFFFFFF);
        Footer.MapOffsetHi = (DWORD)(pStream->StreamSize >> 0x20);
        Footer.BlockSize   = pStream->BlockSize;
        BSWAP_ARRAY32_UNSIGNED(&Footer, sizeof(FILE_BITMAP_FOOTER));
        pStream->BaseWrite(pStream, NULL, &Footer, sizeof(FILE_BITMAP_FOOTER));
    }

    // Close the base class
    BlockStream_Close(pStream);
}